

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::CommonTest_IntMinMaxConstants_Test::TestBody
          (CommonTest_IntMinMaxConstants_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  testing::internal::CmpHelperLT<int,int>(local_18,"kint32min","kint32max",&kint32min,&kint32max);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common_unittest.cc"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_20._M_head_impl._0_4_ = 0x80000000;
  local_28.data_._0_4_ = 0x80000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_18,"static_cast<uint32>(kint32min)","static_cast<uint32>(kint32max) + 1",
             (uint *)&local_20,(uint *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common_unittest.cc"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  testing::internal::CmpHelperLT<long,long>(local_18,"kint64min","kint64max",&kint64min,&kint64max);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common_unittest.cc"
               ,0x34,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8000000000000000
  ;
  local_28.data_ = (AssertHelperData *)&DAT_8000000000000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_18,"static_cast<uint64>(kint64min)","static_cast<uint64>(kint64max) + 1",
             (unsigned_long *)&local_20,(unsigned_long *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common_unittest.cc"
               ,0x35,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_20._M_head_impl = local_20._M_head_impl & 0xffffffff00000000;
  local_28.data_ = local_28.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            (local_18,"0","kuint32max + 1",(int *)&local_20,(uint *)&local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common_unittest.cc"
               ,0x36,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  local_28.data_ = local_28.data_ & 0xffffffff00000000;
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_18,"0","kuint64max + 1",(int *)&local_28,(unsigned_long *)&local_20);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_20);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/stubs/common_unittest.cc"
               ,0x37,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST(CommonTest, IntMinMaxConstants) {
  // kint32min was declared incorrectly in the first release of protobufs.
  // Ugh.
  EXPECT_LT(kint32min, kint32max);
  EXPECT_EQ(static_cast<uint32>(kint32min), static_cast<uint32>(kint32max) + 1);
  EXPECT_LT(kint64min, kint64max);
  EXPECT_EQ(static_cast<uint64>(kint64min), static_cast<uint64>(kint64max) + 1);
  EXPECT_EQ(0, kuint32max + 1);
  EXPECT_EQ(0, kuint64max + 1);
}